

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::PositionalBase::Validate(PositionalBase *this,string *param_1,string *param_2)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  RequiredError *this_00;
  string local_1e8;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream problem;
  string *param_2_local;
  string *param_1_local;
  PositionalBase *this_local;
  
  bVar1 = Base::IsRequired((Base *)this);
  if ((bVar1) && (uVar2 = (*(this->super_NamedBase).super_Base._vptr_Base[2])(), (uVar2 & 1) == 0))
  {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = std::operator<<((ostream *)local_198,"Option \'");
    (*(this->super_NamedBase).super_Base._vptr_Base[0x12])(local_1c8);
    poVar3 = std::operator<<(poVar3,local_1c8);
    std::operator<<(poVar3,"\' is required");
    std::__cxx11::string::~string(local_1c8);
    this_00 = (RequiredError *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    RequiredError::RequiredError(this_00,&local_1e8);
    __cxa_throw(this_00,&RequiredError::typeinfo,RequiredError::~RequiredError);
  }
  return;
}

Assistant:

virtual void Validate(const std::string &, const std::string &) const override
            {
                if (IsRequired() && !Matched())
                {
                    std::ostringstream problem;
                    problem << "Option '" << Name() << "' is required";
#ifdef ARGS_NOEXCEPT
                    error = Error::Required;
                    errorMsg = problem.str();
#else
                    throw RequiredError(problem.str());
#endif
                }
            }